

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.cpp
# Opt level: O2

JoinCondition *
duckdb::MaybeInvertConditions
          (JoinCondition *__return_storage_ptr__,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *condition,
          bool invert)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *__u;
  ExpressionType EVar1;
  pointer pEVar2;
  BoundComparisonExpression *pBVar3;
  undefined3 in_register_00000011;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *__u_00;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (condition);
  pBVar3 = BaseExpression::Cast<duckdb::BoundComparisonExpression>(&pEVar2->super_BaseExpression);
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  __u_00 = &pBVar3->right;
  __u = &pBVar3->left;
  if (CONCAT31(in_register_00000011,invert) != 0) {
    __u_00 = &pBVar3->left;
    __u = &pBVar3->right;
  }
  ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::operator=
            ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
             __return_storage_ptr__,
             (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)__u);
  ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::operator=
            ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
             &__return_storage_ptr__->right,
             (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)__u_00
            );
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (condition);
  EVar1 = (pEVar2->super_BaseExpression).type;
  __return_storage_ptr__->comparison = EVar1;
  if (invert) {
    EVar1 = FlipComparisonExpression(EVar1);
    __return_storage_ptr__->comparison = EVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static JoinCondition MaybeInvertConditions(unique_ptr<Expression> condition, bool invert) {
	auto &comparison = condition->Cast<BoundComparisonExpression>();
	JoinCondition cond;
	cond.left = !invert ? std::move(comparison.left) : std::move(comparison.right);
	cond.right = !invert ? std::move(comparison.right) : std::move(comparison.left);
	cond.comparison = condition->GetExpressionType();
	if (invert) {
		// reverse comparison expression if we reverse the order of the children
		cond.comparison = FlipComparisonExpression(cond.comparison);
	}
	return cond;
}